

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O3

void dumpAttribute(raw_ostream *OS,DWARFDie *Die,uint64_t *OffsetPtr,Attribute Attr,Form Form,
                  uint Indent,DIDumpOptions DumpOpts)

{
  size_t *psVar1;
  byte bVar2;
  DWARFContext *pDVar3;
  MCRegisterInfo *MRI;
  DWARFObject *pDVar4;
  _Head_base<0UL,_const_llvm::DWARFObject_*,_false> Obj;
  char *pcVar5;
  DWARFDebugInfoEntry *pDVar6;
  DWARFSection *pDVar7;
  undefined8 uVar8;
  DIDumpOptions DumpOpts_00;
  DIDumpOptions DumpOpts_01;
  DIDumpOptions DumpOpts_02;
  DIDumpOptions DumpOpts_03;
  DIDumpOptions DumpOpts_04;
  DIDumpOptions DumpOpts_05;
  DIDumpOptions DumpOpts_06;
  DIDumpOptions DumpOpts_07;
  DIDumpOptions DumpOpts_08;
  long lVar9;
  undefined1 auVar10 [16];
  undefined2 uVar11;
  undefined1 uVar12;
  undefined7 uVar13;
  bool bVar14;
  undefined4 uVar15;
  DWARFDie DVar16;
  undefined1 auVar17 [8];
  bool bVar18;
  bool bVar19;
  bool bVar20;
  Attribute Attr_00;
  undefined2 uVar21;
  int iVar22;
  uint Indent_00;
  int iVar23;
  uint uVar24;
  uint uVar25;
  size_t sVar26;
  LineTable *pLVar27;
  char *pcVar28;
  undefined8 *puVar29;
  raw_ostream *prVar30;
  DWARFObject *pDVar31;
  HighlightColor Color;
  void *__buf;
  void *__buf_00;
  void *extraout_RDX;
  Error *E;
  void *__buf_01;
  void *extraout_RDX_00;
  void *__buf_02;
  void *extraout_RDX_01;
  void *__buf_03;
  DWARFAddressRange *R;
  DWARFUnit *pDVar32;
  ulong uVar33;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aVar34;
  StringRef Fmt;
  StringRef Fmt_00;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef CompDir;
  Optional<unsigned_long> OVar35;
  StringRef Str_05;
  StringRef SVar36;
  undefined5 uStack_3d0;
  undefined3 uStack_3cb;
  char BaseIndent [13];
  DWARFDataExtractor Data;
  long local_388;
  _func_int **pp_Stack_208;
  uint64_t Index;
  uint8_t local_1f8;
  uint8_t local_1f7;
  DWARFObject *local_1f0;
  DWARFSection *local_1e8;
  ErrorAdapter local_1e0;
  DWARFUnit *local_1d0;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  uint uStack_1c0;
  undefined4 uStack_1bc;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_1b8 [2];
  undefined1 auStack_1a8 [8];
  string Space;
  undefined1 local_140 [8];
  undefined1 auStack_138 [8];
  uint64_t HighPC;
  raw_ostream local_128;
  undefined1 local_e8 [8];
  uint64_t Offset;
  string File;
  undefined1 local_b8 [8];
  DWARFFormValue FormValue;
  uint uStack_80;
  undefined4 uStack_7c;
  undefined2 uStack_73;
  undefined1 uStack_71;
  anon_union_16_2_eb0c4e0b_for_DWARFUnit_7 local_68 [2];
  Form local_42;
  DWARFUnit *pDStack_40;
  Form Form_local;
  undefined2 local_38;
  char local_36;
  Attribute local_32 [4];
  Attribute Attr_local;
  undefined4 extraout_var;
  
  if (Die->U == (DWARFUnit *)0x0) {
    return;
  }
  if (Die->Die == (DWARFDebugInfoEntry *)0x0) {
    return;
  }
  builtin_strncpy(BaseIndent,"    ",5);
  uStack_3d0 = 0x2020202020;
  uStack_3cb = 0x202020;
  local_42 = Form;
  local_32[0] = Attr;
  sVar26 = strlen((char *)&uStack_3d0);
  SVar36.Length = sVar26;
  SVar36.Data = (char *)&uStack_3d0;
  llvm::raw_ostream::operator<<(OS,SVar36);
  llvm::raw_ostream::indent(OS,Indent + 2);
  llvm::WithColor::WithColor((WithColor *)auStack_138,OS,Attribute,false);
  auStack_1a8 = (undefined1  [8])&PTR_anchor_010786d0;
  Space._M_dataplus._M_p = (pointer)local_32;
  Fmt.Length = 3;
  Fmt.Data = "{0}";
  llvm::
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<llvm::dwarf::Attribute_&>_>_>::
  formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<llvm::dwarf::Attribute_&>_>_>
                  *)(BaseIndent + 8),Fmt,
                 (tuple<llvm::detail::provider_format_adapter<llvm::dwarf::Attribute_&>_> *)
                 auStack_1a8);
  llvm::raw_ostream::operator<<((raw_ostream *)auStack_138,(formatv_object_base *)(BaseIndent + 8));
  if (Data.Section != (DWARFSection *)0x0) {
    operator_delete(Data.Section,local_388 - (long)Data.Section);
  }
  if (Data.super_DataExtractor.Data.Length != 0) {
    operator_delete((void *)Data.super_DataExtractor.Data.Length,
                    (long)Data.Obj - Data.super_DataExtractor.Data.Length);
  }
  llvm::WithColor::~WithColor((WithColor *)auStack_138);
  bVar19 = DumpOpts.Verbose;
  if ((DumpOpts.Verbose != false) || (DumpOpts.ShowForm == true)) {
    auStack_1a8 = (undefined1  [8])&PTR_anchor_01078700;
    Space._M_dataplus._M_p = (pointer)&local_42;
    Fmt_00.Length = 6;
    Fmt_00.Data = " [{0}]";
    llvm::formatv_object<std::tuple<llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>_>_>::
    formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>_>_>
                    *)(BaseIndent + 8),Fmt_00,
                   (tuple<llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>_> *)auStack_1a8
                  );
    llvm::raw_ostream::operator<<(OS,(formatv_object_base *)(BaseIndent + 8));
    if (Data.Section != (DWARFSection *)0x0) {
      operator_delete(Data.Section,local_388 - (long)Data.Section);
    }
    if (Data.super_DataExtractor.Data.Length != 0) {
      operator_delete((void *)Data.super_DataExtractor.Data.Length,
                      (long)Data.Obj - Data.super_DataExtractor.Data.Length);
    }
  }
  pDStack_40 = Die->U;
  llvm::DWARFFormValue::createFromUnit((DWARFFormValue *)local_b8,local_42,pDStack_40,OffsetPtr);
  Str.Length = 2;
  Str.Data = "\t(";
  llvm::raw_ostream::operator<<(OS,Str);
  Offset = (uint64_t)&File._M_string_length;
  File._M_dataplus._M_p = (pointer)0x0;
  File._M_string_length._0_1_ = 0;
  if ((local_32[0] != DW_AT_call_file) && (local_32[0] != DW_AT_decl_file)) {
    OVar35 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_b8);
    if (((undefined1  [16])OVar35.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
LAB_00d6e285:
      if (local_32[0] == DW_AT_high_pc) {
        Attr_00 = DW_AT_high_pc;
        if ((bVar19 != false || DumpOpts.ShowForm != false) ||
           (OVar35 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_b8),
           Attr_00 = local_32[0],
           ((undefined1  [16])OVar35.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0))
        goto LAB_00d6e354;
        if (DumpOpts.ShowAddresses == true) {
          OffsetPtr = (uint64_t *)&stack0xfffffffffffffdf8;
          bVar19 = llvm::DWARFDie::getLowAndHighPC
                             (Die,(uint64_t *)auStack_1a8,(uint64_t *)auStack_138,OffsetPtr);
          if (bVar19) {
            Data.super_DataExtractor.Data.Data = "0x%016lx";
            stack0xfffffffffffffc40 = (DWARFUnit *)&PTR_home_01077fc8;
            Data.super_DataExtractor.Data.Length = (size_t)auStack_138;
            llvm::raw_ostream::operator<<(OS,(format_object_base *)(BaseIndent + 8));
          }
          else {
            OffsetPtr = (uint64_t *)&DumpOpts;
            DumpOpts_05.ShowForm = DumpOpts.ShowForm;
            DumpOpts_05.ShowChildren = DumpOpts.ShowChildren;
            DumpOpts_05.ShowParents = DumpOpts.ShowParents;
            DumpOpts_05.SummarizeTypes = DumpOpts.SummarizeTypes;
            DumpOpts_05.Verbose = DumpOpts.Verbose;
            DumpOpts_05.DisplayRawContents = DumpOpts.DisplayRawContents;
            DumpOpts_05._22_2_ = DumpOpts._22_2_;
            DumpOpts_05.ShowAddresses = DumpOpts.ShowAddresses;
            DumpOpts_05.ParentRecurseDepth = DumpOpts.ParentRecurseDepth;
            DumpOpts_05.Version = DumpOpts.Version;
            DumpOpts_05.AddrSize = DumpOpts.AddrSize;
            DumpOpts_05.DumpType = DumpOpts.DumpType;
            DumpOpts_05.ChildRecurseDepth = DumpOpts.ChildRecurseDepth;
            llvm::DWARFFormValue::dump((DWARFFormValue *)local_b8,OS,DumpOpts_05);
          }
        }
      }
      else if ((local_32[0] == DW_AT_call_line) ||
              (Attr_00 = local_32[0], local_32[0] == DW_AT_decl_line)) {
        OVar35 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_b8);
        if (((undefined1  [16])OVar35.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_00d6ef11;
        llvm::raw_ostream::operator<<(OS,OVar35.Storage.field_0.value);
      }
      else {
LAB_00d6e354:
        bVar20 = llvm::DWARFAttribute::mayHaveLocationDescription(Attr_00);
        uVar15 = DumpOpts._20_4_;
        bVar14 = DumpOpts.SummarizeTypes;
        bVar18 = DumpOpts.ShowForm;
        uVar21 = DumpOpts._16_2_;
        bVar19 = DumpOpts.ShowAddresses;
        uVar13 = DumpOpts._8_7_;
        if (bVar20) {
          OffsetPtr = (uint64_t *)&DumpOpts;
          uVar24 = CONCAT13(DumpOpts.SummarizeTypes,CONCAT12(DumpOpts.ShowForm,DumpOpts._16_2_));
          DumpOpts_06.Verbose = DumpOpts.Verbose;
          DumpOpts_06.DisplayRawContents = DumpOpts.DisplayRawContents;
          DumpOpts_06._22_2_ = DumpOpts._22_2_;
          DumpOpts_06.ShowChildren = (bool)DumpOpts.ShowChildren;
          DumpOpts_06.ShowParents = (bool)DumpOpts.ShowParents;
          DumpOpts_06.ShowForm = DumpOpts.ShowForm;
          DumpOpts_06.SummarizeTypes = DumpOpts.SummarizeTypes;
          uVar8 = CONCAT17(DumpOpts.ShowAddresses,DumpOpts._8_7_);
          FormValue.C = (DWARFContext *)DumpOpts._0_8_;
          pDVar3 = pDStack_40->Context;
          MRI = (pDVar3->RegInfo)._M_t.
                super___uniq_ptr_impl<llvm::MCRegisterInfo,_std::default_delete<llvm::MCRegisterInfo>_>
                ._M_t.
                super__Tuple_impl<0UL,_llvm::MCRegisterInfo_*,_std::default_delete<llvm::MCRegisterInfo>_>
                .super__Head_base<0UL,_llvm::MCRegisterInfo_*,_false>._M_head_impl;
          pDVar4 = (pDVar3->DObj)._M_t.
                   super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                   .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
          bVar20 = llvm::DWARFFormValue::isFormClass((DWARFFormValue *)local_b8,FC_Block);
          if ((bVar20) ||
             (bVar20 = llvm::DWARFFormValue::isFormClass((DWARFFormValue *)local_b8,FC_Exprloc),
             bVar20)) {
            llvm::DWARFFormValue::getAsBlock
                      ((Optional<llvm::ArrayRef<unsigned_char>_> *)(BaseIndent + 8),
                       (DWARFFormValue *)local_b8);
            DVar16 = stack0xfffffffffffffc40;
            if ((char)Data.super_DataExtractor.Data.Length == '\0') {
              pcVar28 = 
              "T &llvm::optional_detail::OptionalStorage<llvm::ArrayRef<unsigned char>>::getValue() & [T = llvm::ArrayRef<unsigned char>]"
              ;
              goto LAB_00d6ef26;
            }
            iVar22 = (*((pDVar3->DObj)._M_t.
                        super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                        .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
                       _vptr_DWARFObject[5])();
            uVar8 = Data.super_DataExtractor._16_8_;
            uVar11 = (pDStack_40->Header).FormParams.Version;
            uVar12 = (pDStack_40->Header).FormParams.AddrSize;
            Data.super_DataExtractor._18_1_ = uVar12;
            Data.super_DataExtractor._16_2_ = uVar11;
            Data.super_DataExtractor.Data.Length._0_2_ = CONCAT11(0,(byte)iVar22);
            Data.super_DataExtractor._19_5_ = SUB85(uVar8,3);
            uVar24 = (uint)(pDStack_40->Header).FormParams.AddrSize;
            unique0x1000223d = DVar16;
            if ((8 < uVar24) || ((0x114U >> (uVar24 & 0x1f) & 1) == 0)) {
              __assert_fail("AddressSize == 8 || AddressSize == 4 || AddressSize == 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFExpression.h"
                            ,0x84,
                            "llvm::DWARFExpression::DWARFExpression(DataExtractor, uint16_t, uint8_t)"
                           );
            }
            OffsetPtr = (uint64_t *)pDStack_40;
            llvm::DWARFExpression::print
                      ((DWARFExpression *)(BaseIndent + 8),OS,MRI,pDStack_40,false);
          }
          else {
            bVar20 = llvm::DWARFFormValue::isFormClass((DWARFFormValue *)local_b8,FC_SectionOffset);
            if (bVar20) {
              OVar35 = llvm::DWARFFormValue::getAsSectionOffset((DWARFFormValue *)local_b8);
              if (((undefined1  [16])OVar35.Storage & (undefined1  [16])0x1) ==
                  (undefined1  [16])0x0) goto LAB_00d6ef11;
              local_e8 = (undefined1  [8])OVar35.Storage.field_0.value;
              llvm::DWARFUnit::getBaseAddress
                        ((Optional<llvm::object::SectionedAddress> *)(BaseIndent + 8),pDStack_40);
              if ((char)Data.super_DataExtractor.Data.Length == '\0') {
                local_68[0].LocSection = (DWARFUnit *)0x0;
              }
              else {
                local_68[0].LocSection = stack0xfffffffffffffc40;
              }
              Indent_00 = Indent + 0x11;
              uStack_80 = (uint)uVar13;
              uStack_7c = (undefined4)((ulong)uVar8 >> 0x20);
              local_1c8 = FormValue.C._0_4_;
              uStack_1c4 = FormValue.C._4_4_;
              uStack_1c0 = uStack_80;
              uStack_1bc = uStack_7c;
              uStack_71 = SUB41(uVar15,3);
              local_36 = uStack_71;
              uStack_73 = SUB42(uVar15,1);
              local_38 = uStack_73;
              local_1b8[0]._0_4_ = uVar24;
              if (pDStack_40->IsDWO == false) {
                pDVar7 = (pDStack_40->field_7).LocSection;
                if ((pDVar7->Data).Length == 0) {
                  iVar22 = (*pDVar4->_vptr_DWARFObject[0xb])(pDVar4);
                  pDVar31 = (DWARFObject *)CONCAT44(extraout_var,iVar22);
                  iVar22 = (*((pDVar3->DObj)._M_t.
                              super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                              .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)
                             ->_vptr_DWARFObject[5])();
                  iVar23 = (*pDVar4->_vptr_DWARFObject[6])(pDVar4);
                  unique0x100012fa = (DWARFUnit *)pDVar31->_vptr_DWARFObject;
                  Data.super_DataExtractor.Data.Data = (pDVar31->Dummy).Data.Data;
                  Data.super_DataExtractor.Data.Length._0_2_ = CONCAT11((char)iVar23,(char)iVar22);
                  OffsetPtr = (uint64_t *)pDVar31->_vptr_DWARFObject;
                  Data.super_DataExtractor._16_8_ = pDVar4;
                  Data.Obj = pDVar31;
                  if ((DWARFDebugInfoEntry *)(pDVar31->Dummy).Data.Data !=
                      (DWARFDebugInfoEntry *)0x0) {
                    uVar21 = (undefined2)*(BufferKind *)&(pDStack_40->Header).FormParams.Version;
                    goto LAB_00d6ecf7;
                  }
                }
                else {
                  Data.super_DataExtractor.Data.Data = (char *)0x400000000;
                  stack0xfffffffffffffc40 = (DWARFUnit *)&Data.super_DataExtractor.Data.Length;
                  iVar22 = (*((pDVar3->DObj)._M_t.
                              super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                              .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)
                             ->_vptr_DWARFObject[5])();
                  iVar23 = (*pDVar4->_vptr_DWARFObject[6])(pDVar4);
                  pp_Stack_208 = (_func_int **)(pDVar7->Data).Data;
                  Index = (pDVar7->Data).Length;
                  local_1f8 = (uint8_t)iVar22;
                  local_1f7 = (uint8_t)iVar23;
                  DumpOpts_06.ParentRecurseDepth = (int)uVar13;
                  DumpOpts_06.Version = SUB72(uVar13,4);
                  DumpOpts_06.AddrSize = SUB71(uVar13,6);
                  DumpOpts_06.ShowAddresses = bVar19;
                  DumpOpts_06._0_8_ = FormValue.C;
                  local_1f0 = pDVar4;
                  local_1e8 = pDVar7;
                  llvm::DWARFFormValue::dump((DWARFFormValue *)local_b8,OS,DumpOpts_06);
                  pcVar28 = OS->OutBufCur;
                  sVar26 = (long)OS->OutBufEnd - (long)pcVar28;
                  if (sVar26 < 2) {
                    llvm::raw_ostream::write(OS,0xdf2725,(void *)0x2,sVar26);
                  }
                  else {
                    pcVar28[0] = ':';
                    pcVar28[1] = ' ';
                    OS->OutBufCur = OS->OutBufCur + 2;
                  }
                  OffsetPtr = (uint64_t *)local_e8;
                  llvm::DWARFDebugLoc::parseOneLocationList
                            ((Expected<llvm::DWARFDebugLoc::LocationList> *)auStack_1a8,
                             (DWARFDebugLoc *)(BaseIndent + 8),
                             (DWARFDataExtractor *)&stack0xfffffffffffffdf8,OffsetPtr);
                  if ((local_140[0] & 1) == 0) {
                    uVar24 = (*((pDVar3->DObj)._M_t.
                                super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                                .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>.
                               _M_head_impl)->_vptr_DWARFObject[5])();
                    uVar25 = (*pDVar4->_vptr_DWARFObject[6])(pDVar4);
                    local_128._vptr_raw_ostream._0_4_ = (undefined4)local_1b8[0].value;
                    auStack_138 = (undefined1  [8])CONCAT44(uStack_1c4,local_1c8);
                    HighPC = CONCAT44(uStack_1bc,uStack_1c0);
                    local_128._vptr_raw_ostream._4_1_ = '\0';
                    local_128._vptr_raw_ostream._5_1_ = (undefined1)local_38;
                    local_128._vptr_raw_ostream._6_1_ = (undefined1)((ushort)local_38 >> 8);
                    local_128._vptr_raw_ostream._7_1_ = local_36;
                    DumpOpts_08.Verbose = false;
                    DumpOpts_08.ShowChildren = (bool)local_1b8[0]._0_1_;
                    DumpOpts_08.ShowParents = (bool)local_1b8[0]._1_1_;
                    DumpOpts_08.ShowForm = (bool)local_1b8[0]._2_1_;
                    DumpOpts_08.SummarizeTypes = (bool)local_1b8[0]._3_1_;
                    DumpOpts_08.DisplayRawContents = (bool)local_128._vptr_raw_ostream._5_1_;
                    DumpOpts_08._22_1_ = local_128._vptr_raw_ostream._6_1_;
                    DumpOpts_08._23_1_ = local_36;
                    OffsetPtr = (uint64_t *)(ulong)(uVar24 & 0xff);
                    DumpOpts_08.ParentRecurseDepth = uStack_1c0;
                    DumpOpts_08.Version = (short)uStack_1bc;
                    DumpOpts_08.AddrSize = (char)((uint)uStack_1bc >> 0x10);
                    DumpOpts_08.ShowAddresses = (bool)(char)((uint)uStack_1bc >> 0x18);
                    DumpOpts_08._0_8_ = auStack_138;
                    llvm::DWARFDebugLoc::LocationList::dump
                              ((LocationList *)auStack_1a8,OS,local_68[0].LocSection,SUB41(uVar24,0)
                               ,uVar25 & 0xff,MRI,pDStack_40,DumpOpts_08,Indent_00);
                  }
                  else {
                    pcVar28 = OS->OutBufCur;
                    if (pcVar28 < OS->OutBufEnd) {
                      OffsetPtr = (uint64_t *)(pcVar28 + 1);
                      OS->OutBufCur = (char *)OffsetPtr;
                      *pcVar28 = '\n';
                    }
                    else {
                      llvm::raw_ostream::write(OS,10,__buf_03,(size_t)OffsetPtr);
                    }
                    llvm::raw_ostream::indent(OS,Indent_00);
                    auVar17 = auStack_1a8;
                    local_1e0.super_FormatAdapter<llvm::Error>.Item.Payload = (ErrorInfoBase *)0x1;
                    if ((local_140[0] & 1) != 0) {
                      auStack_1a8[0] = '\0';
                      auStack_1a8[1] = '\0';
                      auStack_1a8[2] = '\0';
                      auStack_1a8[3] = '\0';
                      auStack_1a8[4] = '\0';
                      auStack_1a8[5] = '\0';
                      auStack_1a8[6] = '\0';
                      auStack_1a8[7] = '\0';
                      local_1e0.super_FormatAdapter<llvm::Error>.Item.Payload =
                           (ErrorInfoBase *)((ulong)auVar17 | 1);
                    }
                    local_1e0.super_FormatAdapter<llvm::Error>.super_format_adapter.
                    _vptr_format_adapter = (_func_int **)&PTR_anchor_01078730;
                    llvm::formatv<llvm::detail::ErrorAdapter>
                              ((formatv_object<std::tuple<llvm::detail::ErrorAdapter>_> *)
                               auStack_138,"error extracting location list: {0}",&local_1e0);
                    llvm::raw_ostream::operator<<(OS,(formatv_object_base *)auStack_138);
                    llvm::formatv_object<std::tuple<llvm::detail::ErrorAdapter>_>::~formatv_object
                              ((formatv_object<std::tuple<llvm::detail::ErrorAdapter>_> *)
                               auStack_138);
                    llvm::detail::ErrorAdapter::~ErrorAdapter(&local_1e0);
                  }
                  llvm::Expected<llvm::DWARFDebugLoc::LocationList>::~Expected
                            ((Expected<llvm::DWARFDebugLoc::LocationList> *)auStack_1a8);
                  llvm::SmallVector<llvm::DWARFDebugLoc::LocationList,_4U>::~SmallVector
                            ((SmallVector<llvm::DWARFDebugLoc::LocationList,_4U> *)(BaseIndent + 8))
                  ;
                }
              }
              else {
                local_1d0 = (DWARFUnit *)(pDStack_40->field_7).LocSection;
                pDVar6 = (DWARFDebugInfoEntry *)(pDStack_40->field_7).LocSectionData.Length;
                iVar22 = (*((pDVar3->DObj)._M_t.
                            super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                            .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
                           _vptr_DWARFObject[5])();
                iVar23 = (*pDVar4->_vptr_DWARFObject[6])(pDVar4);
                Data.super_DataExtractor.Data.Data = (char *)pDVar6;
                stack0xfffffffffffffc40 = local_1d0;
                Data.super_DataExtractor.Data.Length._0_2_ = CONCAT11((char)iVar23,(char)iVar22);
                Data.super_DataExtractor.IsLittleEndian = '\0';
                Data.super_DataExtractor.AddressSize = '\0';
                Data.super_DataExtractor._18_6_ = 0;
                Data.Obj = (DWARFObject *)0x0;
                uVar21 = 4;
                OffsetPtr = (uint64_t *)local_1d0;
                if (pDVar6 != (DWARFDebugInfoEntry *)0x0) {
LAB_00d6ecf7:
                  Space._M_string_length._0_4_ = (undefined4)local_1b8[0].value;
                  auStack_1a8[4] = (undefined1)uStack_1c4;
                  auStack_1a8[5] = uStack_1c4._1_1_;
                  auStack_1a8[6] = uStack_1c4._2_1_;
                  auStack_1a8[7] = uStack_1c4._3_1_;
                  auStack_1a8[0] = (undefined1)local_1c8;
                  auStack_1a8[1] = local_1c8._1_1_;
                  auStack_1a8[2] = local_1c8._2_1_;
                  auStack_1a8[3] = local_1c8._3_1_;
                  Space._M_dataplus._M_p = (pointer)CONCAT44(uStack_1bc,uStack_1c0);
                  Space._M_string_length._4_1_ = 0;
                  Space._M_string_length._5_2_ = local_38;
                  Space._M_string_length._7_1_ = local_36;
                  DumpOpts_07.Verbose = false;
                  DumpOpts_07.ShowChildren = (bool)local_1b8[0]._0_1_;
                  DumpOpts_07.ShowParents = (bool)local_1b8[0]._1_1_;
                  DumpOpts_07.ShowForm = (bool)local_1b8[0]._2_1_;
                  DumpOpts_07.SummarizeTypes = (bool)local_1b8[0]._3_1_;
                  DumpOpts_07._21_2_ = local_38;
                  DumpOpts_07._23_1_ = local_36;
                  DumpOpts_07._8_8_ = Space._M_dataplus._M_p;
                  DumpOpts_07._0_8_ = auStack_1a8;
                  OffsetPtr = (uint64_t *)OS;
                  llvm::DWARFDebugLoclists::dumpLocationList
                            ((DWARFDataExtractor *)(BaseIndent + 8),(uint64_t *)local_e8,uVar21,OS,
                             local_68[0].LocSection,MRI,pDStack_40,DumpOpts_07,Indent_00);
                }
              }
            }
            else {
              DumpOpts_04.ParentRecurseDepth = (int)uVar13;
              DumpOpts_04.Version = SUB72(uVar13,4);
              DumpOpts_04.AddrSize = SUB71(uVar13,6);
              DumpOpts_04.ShowAddresses = bVar19;
              DumpOpts_04._0_8_ = FormValue.C;
              DumpOpts_04.ShowChildren = (bool)(char)uVar21;
              DumpOpts_04.ShowParents = (bool)SUB21(uVar21,1);
              DumpOpts_04.ShowForm = bVar18;
              DumpOpts_04.SummarizeTypes = bVar14;
              DumpOpts_04.Verbose = (bool)(char)uVar15;
              DumpOpts_04.DisplayRawContents = (bool)SUB41(uVar15,1);
              DumpOpts_04._22_2_ = SUB42(uVar15,2);
              llvm::DWARFFormValue::dump((DWARFFormValue *)local_b8,OS,DumpOpts_04);
            }
          }
        }
        else {
          OffsetPtr = (uint64_t *)&DumpOpts;
          DumpOpts_00.ShowForm = DumpOpts.ShowForm;
          DumpOpts_00.ShowChildren = DumpOpts.ShowChildren;
          DumpOpts_00.ShowParents = DumpOpts.ShowParents;
          DumpOpts_00.SummarizeTypes = DumpOpts.SummarizeTypes;
          DumpOpts_00.Verbose = DumpOpts.Verbose;
          DumpOpts_00.DisplayRawContents = DumpOpts.DisplayRawContents;
          DumpOpts_00._22_2_ = DumpOpts._22_2_;
          DumpOpts_00.ShowAddresses = DumpOpts.ShowAddresses;
          DumpOpts_00.ParentRecurseDepth = DumpOpts.ParentRecurseDepth;
          DumpOpts_00.Version = DumpOpts.Version;
          DumpOpts_00.AddrSize = DumpOpts.AddrSize;
          DumpOpts_00.DumpType = DumpOpts.DumpType;
          DumpOpts_00.ChildRecurseDepth = DumpOpts.ChildRecurseDepth;
          llvm::DWARFFormValue::dump((DWARFFormValue *)local_b8,OS,DumpOpts_00);
        }
      }
    }
    else {
      Str_05 = llvm::dwarf::AttributeValueString(local_32[0],OVar35.Storage.field_0._0_4_);
      Color = Enumerator;
LAB_00d6e24c:
      if (Str_05.Length == 0) goto LAB_00d6e285;
      OffsetPtr = (uint64_t *)0x0;
      llvm::WithColor::WithColor((WithColor *)(BaseIndent + 8),OS,Color,false);
      llvm::raw_ostream::operator<<((raw_ostream *)stack0xfffffffffffffc40,Str_05);
      llvm::WithColor::~WithColor((WithColor *)(BaseIndent + 8));
    }
    pcVar28 = "";
    if ((ulong)DumpOpts.ShowAddresses != 0) {
      pcVar28 = " ";
    }
    auStack_1a8 = (undefined1  [8])&Space._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)auStack_1a8,pcVar28,pcVar28 + DumpOpts.ShowAddresses);
    if (local_32[0] < DW_AT_type) {
      if ((local_32[0] == DW_AT_abstract_origin) || (local_32[0] == DW_AT_specification)) {
        join_0x00000010_0x00000000_ =
             llvm::DWARFDie::getAttributeValueAsReferencedDie(Die,(DWARFFormValue *)local_b8);
        pcVar28 = llvm::DWARFDie::getName((DWARFDie *)(BaseIndent + 8),LinkageName);
        if (pcVar28 != (char *)0x0) {
          prVar30 = (raw_ostream *)
                    llvm::raw_ostream::write
                              (OS,auStack_1a8._0_4_,Space._M_dataplus._M_p,(size_t)OffsetPtr);
          Str_00.Length = 1;
          Str_00.Data = "\"";
          prVar30 = llvm::raw_ostream::operator<<(prVar30,Str_00);
          sVar26 = strlen(pcVar28);
          Str_01.Length = sVar26;
          Str_01.Data = pcVar28;
          prVar30 = llvm::raw_ostream::operator<<(prVar30,Str_01);
          pcVar28 = prVar30->OutBufCur;
          if (pcVar28 < prVar30->OutBufEnd) {
            prVar30->OutBufCur = pcVar28 + 1;
            *pcVar28 = '\"';
          }
          else {
            llvm::raw_ostream::write(prVar30,0x22,__buf,(size_t)pcVar28);
          }
        }
      }
      goto LAB_00d6ea76;
    }
    if (local_32[0] == DW_AT_type) {
      prVar30 = (raw_ostream *)
                llvm::raw_ostream::write
                          (OS,auStack_1a8._0_4_,Space._M_dataplus._M_p,(size_t)OffsetPtr);
      Str_02.Length = 1;
      Str_02.Data = "\"";
      llvm::raw_ostream::operator<<(prVar30,Str_02);
      join_0x00000010_0x00000000_ =
           llvm::DWARFDie::getAttributeValueAsReferencedDie(Die,(DWARFFormValue *)local_b8);
      dumpTypeName(OS,(DWARFDie *)(BaseIndent + 8));
      pcVar28 = OS->OutBufCur;
      if (pcVar28 < OS->OutBufEnd) {
        OS->OutBufCur = pcVar28 + 1;
        *pcVar28 = '\"';
      }
      else {
        llvm::raw_ostream::write(OS,0x22,__buf_00,(size_t)OffsetPtr);
      }
      goto LAB_00d6ea76;
    }
    if (local_32[0] != DW_AT_ranges) {
      if (local_32[0] == DW_AT_APPLE_property_attribute) {
        OVar35 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_b8);
        aVar34 = OVar35.Storage.field_0;
        if (((undefined1  [16])OVar35.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pcVar28 = OS->OutBufCur;
          sVar26 = (long)OS->OutBufEnd - (long)pcVar28;
          if (sVar26 < 2) {
            llvm::raw_ostream::write(OS,0xe61b73,(void *)0x2,sVar26);
          }
          else {
            pcVar28[0] = ' ';
            pcVar28[1] = '(';
            OS->OutBufCur = OS->OutBufCur + 2;
          }
          if (aVar34.value == 0) {
            sVar26 = 0x40;
          }
          else {
            sVar26 = 0;
            if (aVar34.value != 0) {
              for (; (aVar34.value >> sVar26 & 1) == 0; sVar26 = sVar26 + 1) {
              }
            }
          }
          uVar24 = (uint)sVar26;
          while( true ) {
            if (0x3f < uVar24) {
              __assert_fail("Shift < 64 && \"undefined behavior\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFDie.cpp"
                            ,0x2c,"void dumpApplePropertyAttribute(raw_ostream &, uint64_t)");
            }
            uVar33 = 1L << ((byte)sVar26 & 0x3f);
            SVar36 = llvm::dwarf::ApplePropertyString((uint)uVar33);
            if (SVar36.Length == 0) {
              Data.super_DataExtractor.Data.Data = "DW_APPLE_PROPERTY_0x%lx";
              stack0xfffffffffffffc40 = (DWARFUnit *)&PTR_home_01077fc8;
              Data.super_DataExtractor.Data.Length = uVar33;
              llvm::raw_ostream::operator<<(OS,(format_object_base *)(BaseIndent + 8));
            }
            else {
              llvm::raw_ostream::operator<<(OS,SVar36);
            }
            if (aVar34.value == uVar33) break;
            pcVar28 = OS->OutBufCur;
            sVar26 = (long)OS->OutBufEnd - (long)pcVar28;
            if (sVar26 < 2) {
              llvm::raw_ostream::write(OS,0xe39b3b,(void *)0x2,sVar26);
            }
            else {
              pcVar28[0] = ',';
              pcVar28[1] = ' ';
              OS->OutBufCur = OS->OutBufCur + 2;
            }
            aVar34.value = aVar34.value ^ uVar33;
            if (aVar34.value == 0) {
              sVar26 = 0x40;
            }
            else {
              sVar26 = 0;
              if (aVar34.value != 0) {
                for (; (aVar34.value >> sVar26 & 1) == 0; sVar26 = sVar26 + 1) {
                }
              }
            }
            uVar24 = (uint)sVar26;
          }
          if (OS->OutBufEnd == OS->OutBufCur) {
            llvm::raw_ostream::write(OS,0xe19bca,(void *)0x1,sVar26);
          }
          else {
            *OS->OutBufCur = ')';
            OS->OutBufCur = OS->OutBufCur + 1;
          }
        }
      }
      goto LAB_00d6ea76;
    }
    Obj._M_head_impl =
         (Die->U->Context->DObj)._M_t.
         super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
         .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
    if (local_b8._0_2_ == DW_FORM_rnglistx) {
      OVar35 = llvm::DWARFFormValue::getAsSectionOffset((DWARFFormValue *)local_b8);
      if (((undefined1  [16])OVar35.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0)
      goto LAB_00d6ef11;
      OffsetPtr = (uint64_t *)pDStack_40;
      if ((pDStack_40->RngListTable).Storage.hasVal == true) {
        OffsetPtr = (pDStack_40->RngListTable).Storage.field_0.value.
                    super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.Offsets.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
        if ((ulong)OVar35.Storage.field_0._0_4_ <
            (ulong)((long)(pDStack_40->RngListTable).Storage.field_0.value.
                          super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.Offsets.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)OffsetPtr >> 3)) {
          llvm::DWARFFormValue::createFromUValue
                    (DW_FORM_sec_offset,
                     (uint64_t)
                     (&((DWARFUnit *)OffsetPtr)->_vptr_DWARFUnit)[OVar35.Storage.field_0._0_4_]);
          OffsetPtr = (uint64_t *)&DumpOpts;
          DumpOpts_01.ShowForm = DumpOpts.ShowForm;
          DumpOpts_01.ShowChildren = DumpOpts.ShowChildren;
          DumpOpts_01.ShowParents = DumpOpts.ShowParents;
          DumpOpts_01.SummarizeTypes = DumpOpts.SummarizeTypes;
          DumpOpts_01.Verbose = DumpOpts.Verbose;
          DumpOpts_01.DisplayRawContents = DumpOpts.DisplayRawContents;
          DumpOpts_01._22_2_ = DumpOpts._22_2_;
          DumpOpts_01.ShowAddresses = DumpOpts.ShowAddresses;
          DumpOpts_01.ParentRecurseDepth = DumpOpts.ParentRecurseDepth;
          DumpOpts_01.Version = DumpOpts.Version;
          DumpOpts_01.AddrSize = DumpOpts.AddrSize;
          DumpOpts_01.DumpType = DumpOpts.DumpType;
          DumpOpts_01.ChildRecurseDepth = DumpOpts.ChildRecurseDepth;
          llvm::DWARFFormValue::dump((DWARFFormValue *)(BaseIndent + 8),OS,DumpOpts_01);
        }
      }
    }
    llvm::DWARFDie::getAddressRanges
              ((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                *)(BaseIndent + 8),Die);
    if ((Data.super_DataExtractor._16_8_ & 1) == 0) {
      if (DumpOpts.ShowAddresses == true) {
        bVar2 = (pDStack_40->Header).FormParams.AddrSize;
        __buf_02 = extraout_RDX;
        if (DumpOpts.Verbose == true) {
          (**(code **)((long)(Obj._M_head_impl)->_vptr_DWARFObject + 0x20))();
          __buf_02 = extraout_RDX_00;
        }
        pcVar28 = Data.super_DataExtractor.Data.Data;
        if (stack0xfffffffffffffc40 != (DWARFUnit *)Data.super_DataExtractor.Data.Data) {
          pDVar32 = stack0xfffffffffffffc40;
          do {
            pcVar5 = OS->OutBufCur;
            if (pcVar5 < OS->OutBufEnd) {
              OS->OutBufCur = pcVar5 + 1;
              *pcVar5 = '\n';
            }
            else {
              llvm::raw_ostream::write(OS,10,__buf_02,(size_t)OffsetPtr);
            }
            llvm::raw_ostream::indent(OS,Indent + 0x11);
            auStack_138 = (undefined1  [8])0xffffffffffffffff;
            HighPC = 0x1040000ffffffff;
            local_128._vptr_raw_ostream._4_1_ = '\0';
            local_128._vptr_raw_ostream._5_1_ = '\0';
            local_128._vptr_raw_ostream._0_4_ = 0;
            lVar9 = (ulong)CONCAT11(local_128._vptr_raw_ostream._7_1_,
                                    local_128._vptr_raw_ostream._6_1_) << 0x30;
            DumpOpts_02.ParentRecurseDepth = 0xffffffff;
            DumpOpts_02.Version = 0;
            DumpOpts_02.AddrSize = '\x04';
            DumpOpts_02.ShowAddresses = true;
            DumpOpts_02.DumpType = 0xffffffff;
            DumpOpts_02.ChildRecurseDepth = 0xffffffff;
            DumpOpts_02.ShowChildren = (bool)(char)lVar9;
            DumpOpts_02.ShowParents = (bool)(char)((ulong)lVar9 >> 8);
            DumpOpts_02.ShowForm = (bool)(char)((ulong)lVar9 >> 0x10);
            DumpOpts_02.SummarizeTypes = (bool)(char)((ulong)lVar9 >> 0x18);
            DumpOpts_02.Verbose = (bool)(char)((ulong)lVar9 >> 0x20);
            DumpOpts_02.DisplayRawContents = (bool)(char)((ulong)lVar9 >> 0x28);
            DumpOpts_02._22_2_ = (short)((ulong)lVar9 >> 0x30);
            llvm::DWARFAddressRange::dump((DWARFAddressRange *)pDVar32,OS,(uint)bVar2,DumpOpts_02);
            OffsetPtr = (uint64_t *)&DumpOpts;
            DumpOpts_03.ShowForm = DumpOpts.ShowForm;
            DumpOpts_03.ShowChildren = DumpOpts.ShowChildren;
            DumpOpts_03.ShowParents = DumpOpts.ShowParents;
            DumpOpts_03.SummarizeTypes = DumpOpts.SummarizeTypes;
            DumpOpts_03.Verbose = DumpOpts.Verbose;
            DumpOpts_03.DisplayRawContents = DumpOpts.DisplayRawContents;
            DumpOpts_03._22_2_ = DumpOpts._22_2_;
            DumpOpts_03.ShowAddresses = DumpOpts.ShowAddresses;
            DumpOpts_03.ParentRecurseDepth = DumpOpts.ParentRecurseDepth;
            DumpOpts_03.Version = DumpOpts.Version;
            DumpOpts_03.AddrSize = DumpOpts.AddrSize;
            DumpOpts_03.DumpType = DumpOpts.DumpType;
            DumpOpts_03.ChildRecurseDepth = DumpOpts.ChildRecurseDepth;
            llvm::DWARFFormValue::dumpAddressSection
                      (Obj._M_head_impl,OS,DumpOpts_03,(uint64_t)pDVar32->InfoSection);
            pDVar32 = (DWARFUnit *)&pDVar32->Header;
            __buf_02 = extraout_RDX_01;
          } while (pDVar32 != (DWARFUnit *)pcVar28);
        }
      }
    }
    else {
      prVar30 = llvm::WithColor::error();
      Str_03.Length = 0x19;
      Str_03.Data = "decoding address ranges: ";
      prVar30 = llvm::raw_ostream::operator<<(prVar30,Str_03);
      File.field_2._8_8_ = 1;
      if ((Data.super_DataExtractor._16_8_ & 1) != 0) {
        pDVar32 = stack0xfffffffffffffc40;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = Data.super_DataExtractor.Data.Data;
        stack0xfffffffffffffc40 = (DWARFDie)(auVar10 << 0x40);
        File.field_2._8_8_ = (ulong)pDVar32 | 1;
      }
      llvm::toString_abi_cxx11_((string *)auStack_138,(llvm *)(File.field_2._M_local_buf + 8),E);
      prVar30 = (raw_ostream *)
                llvm::raw_ostream::write(prVar30,auStack_138._0_4_,(void *)HighPC,(size_t)OffsetPtr)
      ;
      pcVar28 = prVar30->OutBufCur;
      if (pcVar28 < prVar30->OutBufEnd) {
        prVar30->OutBufCur = pcVar28 + 1;
        *pcVar28 = '\n';
      }
      else {
        llvm::raw_ostream::write(prVar30,10,__buf_01,(size_t)pcVar28);
      }
      if (auStack_138 != (undefined1  [8])&local_128) {
        operator_delete((void *)auStack_138,
                        CONCAT17(local_128._vptr_raw_ostream._7_1_,
                                 CONCAT16(local_128._vptr_raw_ostream._6_1_,
                                          CONCAT15(local_128._vptr_raw_ostream._5_1_,
                                                   CONCAT14(local_128._vptr_raw_ostream._4_1_,
                                                            local_128._vptr_raw_ostream._0_4_)))) +
                        1);
      }
      if ((long *)(File.field_2._8_8_ & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)(File.field_2._8_8_ & 0xfffffffffffffffe) + 8))();
      }
    }
    llvm::Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
    ::~Expected((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                 *)(BaseIndent + 8));
LAB_00d6ea76:
    Str_04.Length = 2;
    Str_04.Data = ")\n";
    llvm::raw_ostream::operator<<(OS,Str_04);
    if (auStack_1a8 != (undefined1  [8])&Space._M_string_length) {
      operator_delete((void *)auStack_1a8,
                      CONCAT17(Space._M_string_length._7_1_,
                               CONCAT25(Space._M_string_length._5_2_,
                                        CONCAT14(Space._M_string_length._4_1_,
                                                 (uint)Space._M_string_length))) + 1);
    }
    if ((size_type *)Offset != &File._M_string_length) {
      operator_delete((void *)Offset,
                      CONCAT71(File._M_string_length._1_7_,(undefined1)File._M_string_length) + 1);
    }
    return;
  }
  pLVar27 = llvm::DWARFContext::getLineTableForUnit(pDStack_40->Context,pDStack_40);
  if (pLVar27 == (LineTable *)0x0) goto LAB_00d6e285;
  OVar35 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_b8);
  if (((undefined1  [16])OVar35.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar28 = llvm::DWARFUnit::getCompilationDir(pDStack_40);
    if (pcVar28 == (char *)0x0) {
      OffsetPtr = (uint64_t *)0x0;
    }
    else {
      OffsetPtr = (uint64_t *)strlen(pcVar28);
    }
    CompDir.Length = (size_t)OffsetPtr;
    CompDir.Data = pcVar28;
    bVar18 = llvm::DWARFDebugLine::Prologue::getFileNameByIndex
                       (&pLVar27->Prologue,OVar35.Storage.field_0.value,CompDir,AbsoluteFilePath,
                        (string *)&Offset,native);
    if (bVar18) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_1a8,'\"',
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&Offset);
      puVar29 = (undefined8 *)
                std::__cxx11::string::_M_replace_aux
                          ((ulong)auStack_1a8,(ulong)Space._M_dataplus._M_p,0,'\x01');
      psVar1 = &Data.super_DataExtractor.Data.Length;
      OffsetPtr = puVar29 + 2;
      if ((DWARFUnit *)*puVar29 == (DWARFUnit *)OffsetPtr) {
        Data.super_DataExtractor.Data.Length = (size_t)((DWARFUnit *)OffsetPtr)->_vptr_DWARFUnit;
        Data.super_DataExtractor._16_8_ = puVar29[3];
        unique0x10002235 = (DWARFUnit *)psVar1;
      }
      else {
        Data.super_DataExtractor.Data.Length = (size_t)((DWARFUnit *)OffsetPtr)->_vptr_DWARFUnit;
        unique0x1000222d = (DWARFUnit *)*puVar29;
      }
      Data.super_DataExtractor.Data.Data = (char *)puVar29[1];
      *puVar29 = OffsetPtr;
      puVar29[1] = 0;
      *(undefined1 *)(puVar29 + 2) = 0;
      std::__cxx11::string::operator=((string *)&Offset,(string *)(BaseIndent + 8));
      if (stack0xfffffffffffffc40 != (DWARFUnit *)psVar1) {
        operator_delete(stack0xfffffffffffffc40,Data.super_DataExtractor.Data.Length + 1);
      }
      if (auStack_1a8 != (undefined1  [8])&Space._M_string_length) {
        operator_delete((void *)auStack_1a8,
                        CONCAT17(Space._M_string_length._7_1_,
                                 CONCAT25(Space._M_string_length._5_2_,
                                          CONCAT14(Space._M_string_length._4_1_,
                                                   (uint)Space._M_string_length))) + 1);
      }
      Str_05.Length = (size_t)File._M_dataplus._M_p;
      Str_05.Data = (char *)Offset;
      Color = String;
      goto LAB_00d6e24c;
    }
    goto LAB_00d6e285;
  }
LAB_00d6ef11:
  pcVar28 = 
  "T &llvm::optional_detail::OptionalStorage<unsigned long>::getValue() & [T = unsigned long]";
LAB_00d6ef26:
  __assert_fail("hasVal",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                ,0xad,pcVar28);
}

Assistant:

static void dumpAttribute(raw_ostream &OS, const DWARFDie &Die,
                          uint64_t *OffsetPtr, dwarf::Attribute Attr,
                          dwarf::Form Form, unsigned Indent,
                          DIDumpOptions DumpOpts) {
  if (!Die.isValid())
    return;
  const char BaseIndent[] = "            ";
  OS << BaseIndent;
  OS.indent(Indent + 2);
  WithColor(OS, HighlightColor::Attribute) << formatv("{0}", Attr);

  if (DumpOpts.Verbose || DumpOpts.ShowForm)
    OS << formatv(" [{0}]", Form);

  DWARFUnit *U = Die.getDwarfUnit();
  DWARFFormValue FormValue = DWARFFormValue::createFromUnit(Form, U, OffsetPtr);

  OS << "\t(";

  StringRef Name;
  std::string File;
  auto Color = HighlightColor::Enumerator;
  if (Attr == DW_AT_decl_file || Attr == DW_AT_call_file) {
    Color = HighlightColor::String;
    if (const auto *LT = U->getContext().getLineTableForUnit(U))
      if (LT->getFileNameByIndex(
              FormValue.getAsUnsignedConstant().getValue(),
              U->getCompilationDir(),
              DILineInfoSpecifier::FileLineInfoKind::AbsoluteFilePath, File)) {
        File = '"' + File + '"';
        Name = File;
      }
  } else if (Optional<uint64_t> Val = FormValue.getAsUnsignedConstant())
    Name = AttributeValueString(Attr, *Val);

  if (!Name.empty())
    WithColor(OS, Color) << Name;
  else if (Attr == DW_AT_decl_line || Attr == DW_AT_call_line)
    OS << *FormValue.getAsUnsignedConstant();
  else if (Attr == DW_AT_high_pc && !DumpOpts.ShowForm && !DumpOpts.Verbose &&
           FormValue.getAsUnsignedConstant()) {
    if (DumpOpts.ShowAddresses) {
      // Print the actual address rather than the offset.
      uint64_t LowPC, HighPC, Index;
      if (Die.getLowAndHighPC(LowPC, HighPC, Index))
        OS << format("0x%016" PRIx64, HighPC);
      else
        FormValue.dump(OS, DumpOpts);
    }
  } else if (DWARFAttribute::mayHaveLocationDescription(Attr))
    dumpLocation(OS, FormValue, U, sizeof(BaseIndent) + Indent + 4, DumpOpts);
  else
    FormValue.dump(OS, DumpOpts);

  std::string Space = DumpOpts.ShowAddresses ? " " : "";

  // We have dumped the attribute raw value. For some attributes
  // having both the raw value and the pretty-printed value is
  // interesting. These attributes are handled below.
  if (Attr == DW_AT_specification || Attr == DW_AT_abstract_origin) {
    if (const char *Name =
            Die.getAttributeValueAsReferencedDie(FormValue).getName(
                DINameKind::LinkageName))
      OS << Space << "\"" << Name << '\"';
  } else if (Attr == DW_AT_type) {
    OS << Space << "\"";
    dumpTypeName(OS, Die.getAttributeValueAsReferencedDie(FormValue));
    OS << '"';
  } else if (Attr == DW_AT_APPLE_property_attribute) {
    if (Optional<uint64_t> OptVal = FormValue.getAsUnsignedConstant())
      dumpApplePropertyAttribute(OS, *OptVal);
  } else if (Attr == DW_AT_ranges) {
    const DWARFObject &Obj = Die.getDwarfUnit()->getContext().getDWARFObj();
    // For DW_FORM_rnglistx we need to dump the offset separately, since
    // we have only dumped the index so far.
    if (FormValue.getForm() == DW_FORM_rnglistx)
      if (auto RangeListOffset =
              U->getRnglistOffset(*FormValue.getAsSectionOffset())) {
        DWARFFormValue FV = DWARFFormValue::createFromUValue(
            dwarf::DW_FORM_sec_offset, *RangeListOffset);
        FV.dump(OS, DumpOpts);
      }
    if (auto RangesOrError = Die.getAddressRanges())
      dumpRanges(Obj, OS, RangesOrError.get(), U->getAddressByteSize(),
                 sizeof(BaseIndent) + Indent + 4, DumpOpts);
    else
      WithColor::error() << "decoding address ranges: "
                         << toString(RangesOrError.takeError()) << '\n';
  }

  OS << ")\n";
}